

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXMaterial.cpp
# Opt level: O2

void __thiscall
Assimp::FBX::Texture::Texture(Texture *this,uint64_t id,Element *element,Document *doc,string *name)

{
  shared_ptr<const_Assimp::FBX::PropertyTable> *this_00;
  PropertyTable *pPVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  Scope *this_01;
  Element *el;
  Element *el_00;
  Element *el_01;
  Element *el_02;
  Token *pTVar4;
  Object *pOVar5;
  Video *pVVar6;
  Token *t;
  Token *t_00;
  Token *t_01;
  Token *t_02;
  element_type *peVar7;
  float fVar8;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  aiVector3t<float> aVar9;
  bool ok;
  string local_c0;
  allocator<char> local_99;
  Element *local_98;
  _Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
  local_90;
  undefined1 local_78 [16];
  string *local_68;
  string *local_60;
  string *local_58;
  string *local_50;
  Document *local_48;
  Element *local_40;
  Element *local_38;
  
  local_78._8_8_ = local_78._0_8_;
  local_48 = doc;
  Object::Object(&this->super_Object,id,element,name);
  (this->super_Object)._vptr_Object = (_func_int **)&PTR__Texture_00821990;
  (this->uvTrans).x = 0.0;
  (this->uvTrans).y = 0.0;
  (this->uvScaling).x = 1.0;
  (this->uvScaling).y = 1.0;
  (this->type)._M_dataplus._M_p = (pointer)&(this->type).field_2;
  (this->type)._M_string_length = 0;
  (this->type).field_2._M_local_buf[0] = '\0';
  (this->relativeFileName)._M_dataplus._M_p = (pointer)&(this->relativeFileName).field_2;
  (this->relativeFileName)._M_string_length = 0;
  (this->relativeFileName).field_2._M_local_buf[0] = '\0';
  (this->fileName)._M_dataplus._M_p = (pointer)&(this->fileName).field_2;
  (this->fileName)._M_string_length = 0;
  local_50 = (string *)&this->type;
  local_60 = (string *)&this->relativeFileName;
  (this->fileName).field_2._M_local_buf[0] = '\0';
  (this->alphaSource)._M_dataplus._M_p = (pointer)&(this->alphaSource).field_2;
  (this->alphaSource)._M_string_length = 0;
  local_58 = (string *)&this->fileName;
  local_68 = (string *)&this->alphaSource;
  (this->alphaSource).field_2._M_local_buf[0] = '\0';
  (this->props).super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->props).super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->media = (Video *)0x0;
  local_40 = element;
  this_01 = GetRequiredScope(element);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"Type",(allocator<char> *)&local_90);
  el = Scope::operator[](this_01,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"FileName",(allocator<char> *)&local_90);
  el_00 = Scope::operator[](this_01,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"RelativeFilename",(allocator<char> *)&local_90);
  local_98 = Scope::operator[](this_01,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"ModelUVTranslation",(allocator<char> *)&local_90);
  el_01 = Scope::operator[](this_01,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"ModelUVScaling",(allocator<char> *)&local_90);
  local_78._0_8_ = Scope::operator[](this_01,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"Texture_Alpha_Source",(allocator<char> *)&local_90);
  local_38 = Scope::operator[](this_01,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"Cropping",(allocator<char> *)&local_90);
  el_02 = Scope::operator[](this_01,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  if (el != (Element *)0x0) {
    pTVar4 = GetRequiredToken(el,0);
    ParseTokenAsString_abi_cxx11_(&local_c0,(FBX *)pTVar4,t);
    std::__cxx11::string::operator=(local_50,(string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
  }
  if (el_00 != (Element *)0x0) {
    pTVar4 = GetRequiredToken(el_00,0);
    ParseTokenAsString_abi_cxx11_(&local_c0,(FBX *)pTVar4,t_00);
    std::__cxx11::string::operator=(local_58,(string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
  }
  if (local_98 != (Element *)0x0) {
    pTVar4 = GetRequiredToken(local_98,0);
    ParseTokenAsString_abi_cxx11_(&local_c0,(FBX *)pTVar4,t_01);
    std::__cxx11::string::operator=(local_60,(string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
  }
  if (el_01 != (Element *)0x0) {
    pTVar4 = GetRequiredToken(el_01,0);
    fVar8 = ParseTokenAsFloat(pTVar4);
    local_98 = (Element *)CONCAT44(local_98._4_4_,fVar8);
    pTVar4 = GetRequiredToken(el_01,1);
    fVar8 = ParseTokenAsFloat(pTVar4);
    (this->uvTrans).x = local_98._0_4_;
    (this->uvTrans).y = fVar8;
  }
  if ((Element *)local_78._0_8_ != (Element *)0x0) {
    pTVar4 = GetRequiredToken((Element *)local_78._0_8_,0);
    fVar8 = ParseTokenAsFloat(pTVar4);
    local_98 = (Element *)CONCAT44(local_98._4_4_,fVar8);
    pTVar4 = GetRequiredToken((Element *)local_78._0_8_,1);
    fVar8 = ParseTokenAsFloat(pTVar4);
    (this->uvScaling).x = local_98._0_4_;
    (this->uvScaling).y = fVar8;
  }
  if (el_02 == (Element *)0x0) {
    this->crop[0] = 0;
    this->crop[1] = 0;
    this->crop[2] = 0;
    this->crop[3] = 0;
  }
  else {
    pTVar4 = GetRequiredToken(el_02,0);
    uVar3 = ParseTokenAsInt(pTVar4);
    this->crop[0] = uVar3;
    pTVar4 = GetRequiredToken(el_02,1);
    uVar3 = ParseTokenAsInt(pTVar4);
    this->crop[1] = uVar3;
    pTVar4 = GetRequiredToken(el_02,2);
    uVar3 = ParseTokenAsInt(pTVar4);
    this->crop[2] = uVar3;
    pTVar4 = GetRequiredToken(el_02,3);
    uVar3 = ParseTokenAsInt(pTVar4);
    this->crop[3] = uVar3;
  }
  if (local_38 != (Element *)0x0) {
    pTVar4 = GetRequiredToken(local_38,0);
    ParseTokenAsString_abi_cxx11_(&local_c0,(FBX *)pTVar4,t_02);
    std::__cxx11::string::operator=(local_68,(string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"Texture.FbxFileTexture",(allocator<char> *)&ok);
  Util::GetPropertyTable((Util *)&local_90,local_48,&local_c0,local_40,this_01,false);
  this_00 = &this->props;
  std::__shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&this_00->
              super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2> *)&local_90
            );
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_90._M_impl.super__Vector_impl_data._M_finish);
  std::__cxx11::string::~string((string *)&local_c0);
  pPVar1 = (this_00->
           super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"Scaling",(allocator<char> *)&local_90);
  aVar9 = PropertyGet<aiVector3t<float>>(pPVar1,&local_c0,&ok,false);
  local_78._8_4_ = extraout_XMM0_Dc;
  local_78._0_8_ = aVar9._0_8_;
  local_78._12_4_ = extraout_XMM0_Dd;
  std::__cxx11::string::~string((string *)&local_c0);
  auVar2 = local_78;
  if (ok == true) {
    (this->uvScaling).x = (float)local_78._0_4_;
    (this->uvScaling).y = (float)local_78._4_4_;
  }
  pPVar1 = (this_00->
           super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_78 = auVar2;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"Translation",(allocator<char> *)&local_90);
  aVar9 = PropertyGet<aiVector3t<float>>(pPVar1,&local_c0,&ok,false);
  local_78._8_4_ = extraout_XMM0_Dc_00;
  local_78._0_8_ = aVar9._0_8_;
  local_78._12_4_ = extraout_XMM0_Dd_00;
  std::__cxx11::string::~string((string *)&local_c0);
  auVar2 = local_78;
  if (ok == true) {
    (this->uvTrans).x = (float)local_78._0_4_;
    (this->uvTrans).y = (float)local_78._4_4_;
  }
  if (local_48->settings->readTextures == true) {
    local_78 = auVar2;
    Document::GetConnectionsByDestinationSequenced
              ((vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                *)&local_90,local_48,(this->super_Object).id);
    for (peVar7 = (element_type *)local_90._M_impl.super__Vector_impl_data._M_start;
        peVar7 != (element_type *)local_90._M_impl.super__Vector_impl_data._M_finish;
        peVar7 = (element_type *)&(peVar7->lazyProps)._M_t._M_impl.super__Rb_tree_header) {
      pOVar5 = Connection::SourceObject(*(Connection **)&(peVar7->lazyProps)._M_t._M_impl);
      if (pOVar5 == (Object *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_c0,"failed to read source object for texture link, ignoring",
                   &local_99);
        Util::DOMWarning(&local_c0,local_40);
        std::__cxx11::string::~string((string *)&local_c0);
      }
      else {
        pVVar6 = (Video *)__dynamic_cast(pOVar5,&Object::typeinfo,&Video::typeinfo,0);
        if (pVVar6 != (Video *)0x0) {
          this->media = pVVar6;
        }
      }
    }
    std::
    _Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
    ::~_Vector_base(&local_90);
  }
  return;
}

Assistant:

Texture::Texture(uint64_t id, const Element& element, const Document& doc, const std::string& name)
: Object(id,element,name)
, uvScaling(1.0f,1.0f)
, media(0)
{
    const Scope& sc = GetRequiredScope(element);

    const Element* const Type = sc["Type"];
    const Element* const FileName = sc["FileName"];
    const Element* const RelativeFilename = sc["RelativeFilename"];
    const Element* const ModelUVTranslation = sc["ModelUVTranslation"];
    const Element* const ModelUVScaling = sc["ModelUVScaling"];
    const Element* const Texture_Alpha_Source = sc["Texture_Alpha_Source"];
    const Element* const Cropping = sc["Cropping"];

    if(Type) {
        type = ParseTokenAsString(GetRequiredToken(*Type,0));
    }

    if(FileName) {
        fileName = ParseTokenAsString(GetRequiredToken(*FileName,0));
    }

    if(RelativeFilename) {
        relativeFileName = ParseTokenAsString(GetRequiredToken(*RelativeFilename,0));
    }

    if(ModelUVTranslation) {
        uvTrans = aiVector2D(ParseTokenAsFloat(GetRequiredToken(*ModelUVTranslation,0)),
            ParseTokenAsFloat(GetRequiredToken(*ModelUVTranslation,1))
        );
    }

    if(ModelUVScaling) {
        uvScaling = aiVector2D(ParseTokenAsFloat(GetRequiredToken(*ModelUVScaling,0)),
            ParseTokenAsFloat(GetRequiredToken(*ModelUVScaling,1))
        );
    }

    if(Cropping) {
        crop[0] = ParseTokenAsInt(GetRequiredToken(*Cropping,0));
        crop[1] = ParseTokenAsInt(GetRequiredToken(*Cropping,1));
        crop[2] = ParseTokenAsInt(GetRequiredToken(*Cropping,2));
        crop[3] = ParseTokenAsInt(GetRequiredToken(*Cropping,3));
    }
    else {
        // vc8 doesn't support the crop() syntax in initialization lists
        // (and vc9 WARNS about the new (i.e. compliant) behaviour).
        crop[0] = crop[1] = crop[2] = crop[3] = 0;
    }

    if(Texture_Alpha_Source) {
        alphaSource = ParseTokenAsString(GetRequiredToken(*Texture_Alpha_Source,0));
    }

    props = GetPropertyTable(doc,"Texture.FbxFileTexture",element,sc);

    // 3DS Max and FBX SDK use "Scaling" and "Translation" instead of "ModelUVScaling" and "ModelUVTranslation". Use these properties if available.
    bool ok;
    const aiVector3D& scaling = PropertyGet<aiVector3D>(*props, "Scaling", ok);
    if (ok) {
        uvScaling.x = scaling.x;
        uvScaling.y = scaling.y;
    }

    const aiVector3D& trans = PropertyGet<aiVector3D>(*props, "Translation", ok);
    if (ok) {
        uvTrans.x = trans.x;
        uvTrans.y = trans.y;
    }

    // resolve video links
    if(doc.Settings().readTextures) {
        const std::vector<const Connection*>& conns = doc.GetConnectionsByDestinationSequenced(ID());
        for(const Connection* con : conns) {
            const Object* const ob = con->SourceObject();
            if(!ob) {
                DOMWarning("failed to read source object for texture link, ignoring",&element);
                continue;
            }

            const Video* const video = dynamic_cast<const Video*>(ob);
            if(video) {
                media = video;
            }
        }
    }
}